

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snippet.cpp
# Opt level: O0

void __thiscall cpptrace::detail::snippet_manager::build_line_table(snippet_manager *this)

{
  reference pvVar1;
  value_type local_58;
  size_type local_48;
  size_t end_pos;
  size_type local_38;
  size_type local_30;
  size_t terminator_pos;
  size_t pos;
  size_t local_18;
  snippet_manager *local_10;
  snippet_manager *this_local;
  
  pos = 0;
  local_18 = 0;
  local_10 = this;
  std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
  push_back(&this->line_table,(value_type *)&pos);
  terminator_pos = 0;
  while( true ) {
    local_30 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (&this->contents,'\n',terminator_pos);
    if (local_30 == 0xffffffffffffffff) break;
    local_48 = local_30;
    if (local_30 != 0) {
      pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](&this->contents,local_30 - 1);
      if (*pvVar1 == '\r') {
        local_48 = local_48 - 1;
      }
    }
    local_58.begin = terminator_pos;
    local_58.end = local_48;
    std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
    push_back(&this->line_table,&local_58);
    terminator_pos = local_30 + 1;
  }
  end_pos = terminator_pos;
  local_38 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (&this->contents);
  std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
  push_back(&this->line_table,(value_type *)&end_pos);
  return;
}

Assistant:

void build_line_table() {
            line_table.push_back({0, 0});
            std::size_t pos = 0; // stores the start of the current line
            while(true) {
                // find the end of the current line
                std::size_t terminator_pos = contents.find('\n', pos);
                if(terminator_pos == std::string::npos) {
                    line_table.push_back({pos, contents.size()});
                    break;
                } else {
                    std::size_t end_pos = terminator_pos; // one past the end of the current line
                    if(end_pos > 0 && contents[end_pos - 1] == '\r') {
                        end_pos--;
                    }
                    line_table.push_back({pos, end_pos});
                    pos = terminator_pos + 1;
                }
            }
        }